

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

void vkt::ubo::anon_unknown_0::generateCompareSrc
               (ostringstream *src,char *resultVar,VarType *type,string *srcName,string *apiName,
               UniformLayout *layout,int blockNdx,void *basePtr,deUint32 unusedMask,
               MatrixLoadFlags matrixLoadFlag)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  const_reference entry_00;
  ostream *poVar5;
  StructType *pSVar6;
  pointer pSVar7;
  string *__rhs;
  VarType *pVVar8;
  char *__rhs_00;
  DataType local_2a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  string memberApiName;
  undefined1 local_238 [8];
  string memberSrcName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  string op_1;
  __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
  local_1c8;
  ConstIterator memberIter;
  undefined1 local_1a0 [8];
  string elementApiName;
  undefined1 local_160 [8];
  string elementSrcName;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string op;
  int elementNdx;
  VarType *elementType_1;
  int elemNdx;
  UniformLayoutEntry *entry;
  int uniformNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string fullApiName;
  char *typeName;
  DataType elementType;
  bool isArray;
  UniformLayout *layout_local;
  string *apiName_local;
  string *srcName_local;
  VarType *type_local;
  char *resultVar_local;
  ostringstream *src_local;
  
  bVar2 = VarType::isBasicType(type);
  if (bVar2) {
LAB_00c4ad19:
    bVar2 = VarType::isArrayType(type);
    if (bVar2) {
      pVVar8 = VarType::getElementType(type);
      local_2a4 = VarType::getBasicType(pVVar8);
    }
    else {
      local_2a4 = VarType::getBasicType(type);
    }
    fullApiName.field_2._8_8_ = glu::getDataTypeName(local_2a4);
    std::__cxx11::string::string((string *)&local_88,(string *)apiName);
    __rhs_00 = "";
    if (bVar2) {
      __rhs_00 = "[0]";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   &local_88,__rhs_00);
    std::__cxx11::string::~string((string *)&local_88);
    iVar3 = UniformLayout::getUniformLayoutIndex(layout,blockNdx,(string *)local_68);
    entry_00 = std::
               vector<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>::
               operator[](&layout->uniforms,(long)iVar3);
    if (bVar2) {
      for (elementType_1._4_4_ = 0; iVar3 = VarType::getArraySize(type), elementType_1._4_4_ < iVar3
          ; elementType_1._4_4_ = elementType_1._4_4_ + 1) {
        poVar5 = std::operator<<((ostream *)src,"\tresult *= compare_");
        poVar5 = std::operator<<(poVar5,(char *)fullApiName.field_2._8_8_);
        poVar5 = std::operator<<(poVar5,"(");
        poVar5 = std::operator<<(poVar5,(string *)srcName);
        poVar5 = std::operator<<(poVar5,"[");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,elementType_1._4_4_);
        std::operator<<(poVar5,"], ");
        generateValueSrc(src,entry_00,basePtr,elementType_1._4_4_);
        std::operator<<((ostream *)src,");\n");
      }
    }
    else {
      generateSingleCompare(src,local_2a4,srcName,basePtr,entry_00,matrixLoadFlag);
    }
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    bVar2 = VarType::isArrayType(type);
    if (bVar2) {
      pVVar8 = VarType::getElementType(type);
      bVar2 = VarType::isBasicType(pVVar8);
      if (bVar2) goto LAB_00c4ad19;
    }
    bVar2 = VarType::isArrayType(type);
    if (bVar2) {
      pVVar8 = VarType::getElementType(type);
      for (op.field_2._12_4_ = 0; uVar1 = op.field_2._12_4_, iVar3 = VarType::getArraySize(type),
          (int)uVar1 < iVar3; op.field_2._12_4_ = op.field_2._12_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"[",&local_119);
        de::toString<int>((string *)((long)&elementSrcName.field_2 + 8),
                          (int *)(op.field_2._M_local_buf + 0xc));
        std::operator+(&local_f8,&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&elementSrcName.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,&local_f8,"]");
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)(elementSrcName.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
        std::__cxx11::string::string
                  ((string *)(elementApiName.field_2._M_local_buf + 8),(string *)srcName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&elementApiName.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
        std::__cxx11::string::~string((string *)(elementApiName.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&memberIter,(string *)apiName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &memberIter,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
        std::__cxx11::string::~string((string *)&memberIter);
        generateCompareSrc(src,resultVar,pVVar8,(string *)local_160,(string *)local_1a0,layout,
                           blockNdx,basePtr,unusedMask,LOAD_FULL_MATRIX);
        std::__cxx11::string::~string((string *)local_1a0);
        std::__cxx11::string::~string((string *)local_160);
        std::__cxx11::string::~string((string *)local_d8);
      }
    }
    else {
      pSVar6 = VarType::getStruct(type);
      local_1c8._M_current = (StructMember *)StructType::begin(pSVar6);
      while( true ) {
        pSVar6 = VarType::getStruct(type);
        op_1.field_2._8_8_ = StructType::end(pSVar6);
        bVar2 = __gnu_cxx::operator!=
                          (&local_1c8,
                           (__normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
                            *)((long)&op_1.field_2 + 8));
        if (!bVar2) break;
        pSVar7 = __gnu_cxx::
                 __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
                 ::operator->(&local_1c8);
        dVar4 = StructMember::getFlags(pSVar7);
        if ((dVar4 & unusedMask) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,".",
                     (allocator<char> *)(memberSrcName.field_2._M_local_buf + 0xf));
          pSVar7 = __gnu_cxx::
                   __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
                   ::operator->(&local_1c8);
          __rhs = StructMember::getName_abi_cxx11_(pSVar7);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0,&local_210,__rhs);
          std::__cxx11::string::~string((string *)&local_210);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(memberSrcName.field_2._M_local_buf + 0xf));
          std::__cxx11::string::string
                    ((string *)(memberApiName.field_2._M_local_buf + 8),(string *)srcName);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_238,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&memberApiName.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0);
          std::__cxx11::string::~string((string *)(memberApiName.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&local_298,(string *)apiName);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278,&local_298,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0);
          std::__cxx11::string::~string((string *)&local_298);
          pSVar7 = __gnu_cxx::
                   __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
                   ::operator->(&local_1c8);
          pVVar8 = StructMember::getType(pSVar7);
          generateCompareSrc(src,resultVar,pVVar8,(string *)local_238,(string *)local_278,layout,
                             blockNdx,basePtr,unusedMask,LOAD_FULL_MATRIX);
          std::__cxx11::string::~string((string *)local_278);
          std::__cxx11::string::~string((string *)local_238);
          std::__cxx11::string::~string((string *)local_1f0);
        }
        __gnu_cxx::
        __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
        ::operator++(&local_1c8,0);
      }
    }
  }
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream&	src,
						 const char*			resultVar,
						 const VarType&			type,
						 const std::string&		srcName,
						 const std::string&		apiName,
						 const UniformLayout&	layout,
						 int					blockNdx,
						 const void*			basePtr,
						 deUint32				unusedMask,
						 MatrixLoadFlags		matrixLoadFlag)
{
	if (type.isBasicType() || (type.isArrayType() && type.getElementType().isBasicType()))
	{
		// Basic type or array of basic types.
		bool						isArray			= type.isArrayType();
		glu::DataType				elementType		= isArray ? type.getElementType().getBasicType() : type.getBasicType();
		const char*					typeName		= glu::getDataTypeName(elementType);
		std::string					fullApiName		= std::string(apiName) + (isArray ? "[0]" : ""); // Arrays are always postfixed with [0]
		int							uniformNdx		= layout.getUniformLayoutIndex(blockNdx, fullApiName);
		const UniformLayoutEntry&	entry			= layout.uniforms[uniformNdx];

		if (isArray)
		{
			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
			{
				src << "\tresult *= compare_" << typeName << "(" << srcName << "[" << elemNdx << "], ";
				generateValueSrc(src, entry, basePtr, elemNdx);
				src << ");\n";
			}
		}
		else
		{
			generateSingleCompare(src, elementType, srcName, basePtr, entry, matrixLoadFlag);
		}
	}
	else if (type.isArrayType())
	{
		const VarType& elementType = type.getElementType();

		for (int elementNdx = 0; elementNdx < type.getArraySize(); elementNdx++)
		{
			std::string op = std::string("[") + de::toString(elementNdx) + "]";
			std::string elementSrcName = std::string(srcName) + op;
			std::string elementApiName = std::string(apiName) + op;
			generateCompareSrc(src, resultVar, elementType, elementSrcName, elementApiName, layout, blockNdx, basePtr, unusedMask, LOAD_FULL_MATRIX);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
		{
			if (memberIter->getFlags() & unusedMask)
				continue; // Skip member.

			std::string op = std::string(".") + memberIter->getName();
			std::string memberSrcName = std::string(srcName) + op;
			std::string memberApiName = std::string(apiName) + op;
			generateCompareSrc(src, resultVar, memberIter->getType(), memberSrcName, memberApiName, layout, blockNdx, basePtr, unusedMask, LOAD_FULL_MATRIX);
		}
	}
}